

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O0

void PrintGraph(ParseGraphContext *ctx,SynBase *syntax,char *name)

{
  bool bVar1;
  SynIdentifier *pSVar2;
  SynTypeSimple *pSVar3;
  SynTypeAlias *pSVar4;
  SynTypeArray *pSVar5;
  SynTypeReference *pSVar6;
  SynTypeFunction *pSVar7;
  SynTypeGenericInstance *pSVar8;
  SynTypeof *pSVar9;
  SynBool *pSVar10;
  SynNumber *pSVar11;
  SynCharacter *pSVar12;
  SynString *pSVar13;
  SynArray *pSVar14;
  SynGenerator *pSVar15;
  SynAlign *pSVar16;
  SynTypedef *pSVar17;
  SynMemberAccess *pSVar18;
  SynCallArgument *pSVar19;
  SynArrayIndex *pSVar20;
  SynFunctionCall *pSVar21;
  SynPreModify *pSVar22;
  SynPostModify *pSVar23;
  SynGetAddress *pSVar24;
  SynDereference *pSVar25;
  SynSizeof *pSVar26;
  SynNew *pSVar27;
  SynConditional *pSVar28;
  SynReturn *pSVar29;
  SynYield *pSVar30;
  SynBreak *pSVar31;
  SynContinue *pSVar32;
  SynBlock *pSVar33;
  SynIfElse *pSVar34;
  SynFor *pSVar35;
  SynForEachIterator *pSVar36;
  SynForEach *pSVar37;
  SynWhile *pSVar38;
  SynDoWhile *pSVar39;
  SynSwitchCase *pSVar40;
  SynSwitch *pSVar41;
  SynUnaryOp *pSVar42;
  SynBinaryOp *pSVar43;
  SynAssignment *pSVar44;
  SynModifyAssignment *pSVar45;
  SynVariableDefinition *pSVar46;
  SynVariableDefinitions *pSVar47;
  SynAccessor *pSVar48;
  SynFunctionArgument *pSVar49;
  SynFunctionDefinition *pSVar50;
  SynShortFunctionArgument *pSVar51;
  SynShortFunctionDefinition *pSVar52;
  SynConstant *pSVar53;
  SynConstantSet *pSVar54;
  SynClassPrototype *pSVar55;
  SynClassStaticIf *pSVar56;
  SynClassElements *pSVar57;
  SynClassDefinition *pSVar58;
  SynEnumDefinition *pSVar59;
  SynNamespaceDefinition *pSVar60;
  SynModuleImport *pSVar61;
  SynModule *pSVar62;
  char *pcVar63;
  char *pcVar64;
  char *pcVar65;
  undefined8 in_stack_fffffffffffffc68;
  undefined4 uVar66;
  char *local_358;
  char *local_340;
  SynBase *local_328;
  SynBase *expr_1;
  SynModuleImport *import;
  SynModule *node_60;
  SynIdentifier *part_2;
  SynModuleImport *node_59;
  SynBase *arg_25;
  SynIdentifier *part_1;
  SynNamespaceDefinition *node_58;
  SynBase *arg_24;
  SynEnumDefinition *node_57;
  SynBase *arg_23;
  SynClassDefinition *node_56;
  SynBase *arg_22;
  SynBase *arg_21;
  SynBase *arg_20;
  SynBase *arg_19;
  SynBase *arg_18;
  SynBase *arg_17;
  SynClassElements *node_55;
  SynClassStaticIf *node_54;
  SynClassPrototype *node_53;
  SynBase *arg_16;
  SynConstantSet *node_52;
  SynConstant *node_51;
  SynBase *arg_15;
  SynBase *arg_14;
  SynShortFunctionDefinition *node_50;
  SynShortFunctionArgument *node_49;
  SynBase *arg_13;
  SynBase *arg_12;
  SynBase *arg_11;
  SynFunctionDefinition *node_48;
  SynFunctionArgument *node_47;
  SynAccessor *node_46;
  SynBase *arg_10;
  SynVariableDefinitions *node_45;
  SynVariableDefinition *node_44;
  SynModifyAssignment *node_43;
  SynAssignment *node_42;
  SynBinaryOp *node_41;
  SynUnaryOp *node_40;
  SynBase *arg_9;
  SynSwitch *node_39;
  SynBase *arg_8;
  SynSwitchCase *node_38;
  SynBase *arg_7;
  SynDoWhile *node_37;
  SynWhile *node_36;
  SynBase *arg_6;
  SynForEach *node_35;
  SynForEachIterator *node_34;
  SynFor *node_33;
  SynIfElse *node_32;
  SynBase *expr;
  SynBlock *node_31;
  SynContinue *node_30;
  SynBreak *node_29;
  SynYield *node_28;
  SynReturn *node_27;
  SynConditional *node_26;
  SynBase *arg_5;
  SynBase *arg_4;
  SynNew *node_25;
  SynSizeof *node_24;
  SynDereference *node_23;
  SynGetAddress *node_22;
  SynPostModify *node_21;
  SynPreModify *node_20;
  SynBase *arg_3;
  SynBase *arg_2;
  SynFunctionCall *node_19;
  SynBase *arg_1;
  SynArrayIndex *node_18;
  SynCallArgument *node_17;
  SynMemberAccess *node_16;
  SynTypedef *node_15;
  SynAlign *node_14;
  SynBase *value_1;
  SynGenerator *node_13;
  SynBase *value;
  SynArray *node_12;
  SynString *node_11;
  SynCharacter *node_10;
  SynNumber *node_9;
  SynBool *node_8;
  SynTypeof *node_7;
  SynBase *type;
  SynTypeGenericInstance *node_6;
  SynBase *arg;
  SynTypeFunction *node_5;
  SynTypeReference *node_4;
  SynBase *size;
  SynTypeArray *node_3;
  SynTypeAlias *node_2;
  SynIdentifier *part;
  SynTypeSimple *node_1;
  SynIdentifier *node;
  char *name_local;
  SynBase *syntax_local;
  ParseGraphContext *ctx_local;
  
  uVar66 = (undefined4)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  if (ctx->depth < 0x401) {
    bVar1 = isType<SynError>(syntax);
    if (bVar1) {
      PrintIndented(ctx,name,"SynError()");
    }
    else {
      bVar1 = isType<SynNothing>(syntax);
      if (bVar1) {
        PrintIndented(ctx,name,"SynNothing()");
      }
      else {
        pSVar2 = getType<SynIdentifier>(syntax);
        if (pSVar2 == (SynIdentifier *)0x0) {
          bVar1 = isType<SynTypeAuto>(syntax);
          if (bVar1) {
            PrintIndented(ctx,name,"SynTypeAuto()");
          }
          else {
            bVar1 = isType<SynTypeGeneric>(syntax);
            if (bVar1) {
              PrintIndented(ctx,name,"SynTypeGeneric()");
            }
            else {
              pSVar3 = getType<SynTypeSimple>(syntax);
              if (pSVar3 == (SynTypeSimple *)0x0) {
                pSVar4 = getType<SynTypeAlias>(syntax);
                if (pSVar4 == (SynTypeAlias *)0x0) {
                  pSVar5 = getType<SynTypeArray>(syntax);
                  if (pSVar5 == (SynTypeArray *)0x0) {
                    pSVar6 = getType<SynTypeReference>(syntax);
                    if (pSVar6 == (SynTypeReference *)0x0) {
                      pSVar7 = getType<SynTypeFunction>(syntax);
                      if (pSVar7 == (SynTypeFunction *)0x0) {
                        pSVar8 = getType<SynTypeGenericInstance>(syntax);
                        if (pSVar8 == (SynTypeGenericInstance *)0x0) {
                          pSVar9 = getType<SynTypeof>(syntax);
                          if (pSVar9 == (SynTypeof *)0x0) {
                            pSVar10 = getType<SynBool>(syntax);
                            if (pSVar10 == (SynBool *)0x0) {
                              pSVar11 = getType<SynNumber>(syntax);
                              if (pSVar11 == (SynNumber *)0x0) {
                                bVar1 = isType<SynNullptr>(syntax);
                                if (bVar1) {
                                  PrintIndented(ctx,name,"SynNullptr()");
                                }
                                else {
                                  pSVar12 = getType<SynCharacter>(syntax);
                                  if (pSVar12 == (SynCharacter *)0x0) {
                                    pSVar13 = getType<SynString>(syntax);
                                    if (pSVar13 == (SynString *)0x0) {
                                      pSVar14 = getType<SynArray>(syntax);
                                      if (pSVar14 == (SynArray *)0x0) {
                                        pSVar15 = getType<SynGenerator>(syntax);
                                        if (pSVar15 == (SynGenerator *)0x0) {
                                          pSVar16 = getType<SynAlign>(syntax);
                                          if (pSVar16 == (SynAlign *)0x0) {
                                            pSVar17 = getType<SynTypedef>(syntax);
                                            if (pSVar17 == (SynTypedef *)0x0) {
                                              pSVar18 = getType<SynMemberAccess>(syntax);
                                              if (pSVar18 == (SynMemberAccess *)0x0) {
                                                pSVar19 = getType<SynCallArgument>(syntax);
                                                if (pSVar19 == (SynCallArgument *)0x0) {
                                                  pSVar20 = getType<SynArrayIndex>(syntax);
                                                  if (pSVar20 == (SynArrayIndex *)0x0) {
                                                    pSVar21 = getType<SynFunctionCall>(syntax);
                                                    if (pSVar21 == (SynFunctionCall *)0x0) {
                                                      pSVar22 = getType<SynPreModify>(syntax);
                                                      if (pSVar22 == (SynPreModify *)0x0) {
                                                        pSVar23 = getType<SynPostModify>(syntax);
                                                        if (pSVar23 == (SynPostModify *)0x0) {
                                                          pSVar24 = getType<SynGetAddress>(syntax);
                                                          if (pSVar24 == (SynGetAddress *)0x0) {
                                                            pSVar25 = getType<SynDereference>
                                                                                (syntax);
                                                            if (pSVar25 == (SynDereference *)0x0) {
                                                              pSVar26 = getType<SynSizeof>(syntax);
                                                              if (pSVar26 == (SynSizeof *)0x0) {
                                                                pSVar27 = getType<SynNew>(syntax);
                                                                if (pSVar27 == (SynNew *)0x0) {
                                                                  pSVar28 = getType<SynConditional>
                                                                                      (syntax);
                                                                  if (pSVar28 ==
                                                                      (SynConditional *)0x0) {
                                                                    pSVar29 = getType<SynReturn>(
                                                  syntax);
                                                  if (pSVar29 == (SynReturn *)0x0) {
                                                    pSVar30 = getType<SynYield>(syntax);
                                                    if (pSVar30 == (SynYield *)0x0) {
                                                      pSVar31 = getType<SynBreak>(syntax);
                                                      if (pSVar31 == (SynBreak *)0x0) {
                                                        pSVar32 = getType<SynContinue>(syntax);
                                                        if (pSVar32 == (SynContinue *)0x0) {
                                                          pSVar33 = getType<SynBlock>(syntax);
                                                          if (pSVar33 == (SynBlock *)0x0) {
                                                            pSVar34 = getType<SynIfElse>(syntax);
                                                            if (pSVar34 == (SynIfElse *)0x0) {
                                                              pSVar35 = getType<SynFor>(syntax);
                                                              if (pSVar35 == (SynFor *)0x0) {
                                                                pSVar36 = 
                                                  getType<SynForEachIterator>(syntax);
                                                  if (pSVar36 == (SynForEachIterator *)0x0) {
                                                    pSVar37 = getType<SynForEach>(syntax);
                                                    if (pSVar37 == (SynForEach *)0x0) {
                                                      pSVar38 = getType<SynWhile>(syntax);
                                                      if (pSVar38 == (SynWhile *)0x0) {
                                                        pSVar39 = getType<SynDoWhile>(syntax);
                                                        if (pSVar39 == (SynDoWhile *)0x0) {
                                                          pSVar40 = getType<SynSwitchCase>(syntax);
                                                          if (pSVar40 == (SynSwitchCase *)0x0) {
                                                            pSVar41 = getType<SynSwitch>(syntax);
                                                            if (pSVar41 == (SynSwitch *)0x0) {
                                                              pSVar42 = getType<SynUnaryOp>(syntax);
                                                              if (pSVar42 == (SynUnaryOp *)0x0) {
                                                                pSVar43 = getType<SynBinaryOp>
                                                                                    (syntax);
                                                                if (pSVar43 == (SynBinaryOp *)0x0) {
                                                                  pSVar44 = getType<SynAssignment>
                                                                                      (syntax);
                                                                  if (pSVar44 ==
                                                                      (SynAssignment *)0x0) {
                                                                    pSVar45 = 
                                                  getType<SynModifyAssignment>(syntax);
                                                  if (pSVar45 == (SynModifyAssignment *)0x0) {
                                                    pSVar46 = getType<SynVariableDefinition>(syntax)
                                                    ;
                                                    if (pSVar46 == (SynVariableDefinition *)0x0) {
                                                      pSVar47 = getType<SynVariableDefinitions>
                                                                          (syntax);
                                                      if (pSVar47 == (SynVariableDefinitions *)0x0)
                                                      {
                                                        pSVar48 = getType<SynAccessor>(syntax);
                                                        if (pSVar48 == (SynAccessor *)0x0) {
                                                          pSVar49 = getType<SynFunctionArgument>
                                                                              (syntax);
                                                          if (pSVar49 == (SynFunctionArgument *)0x0)
                                                          {
                                                            pSVar50 = getType<SynFunctionDefinition>
                                                                                (syntax);
                                                            if (pSVar50 ==
                                                                (SynFunctionDefinition *)0x0) {
                                                              pSVar51 = 
                                                  getType<SynShortFunctionArgument>(syntax);
                                                  if (pSVar51 == (SynShortFunctionArgument *)0x0) {
                                                    pSVar52 = getType<SynShortFunctionDefinition>
                                                                        (syntax);
                                                    if (pSVar52 == (SynShortFunctionDefinition *)0x0
                                                       ) {
                                                      pSVar53 = getType<SynConstant>(syntax);
                                                      if (pSVar53 == (SynConstant *)0x0) {
                                                        pSVar54 = getType<SynConstantSet>(syntax);
                                                        if (pSVar54 == (SynConstantSet *)0x0) {
                                                          pSVar55 = getType<SynClassPrototype>
                                                                              (syntax);
                                                          if (pSVar55 == (SynClassPrototype *)0x0) {
                                                            pSVar56 = getType<SynClassStaticIf>
                                                                                (syntax);
                                                            if (pSVar56 == (SynClassStaticIf *)0x0)
                                                            {
                                                              pSVar57 = getType<SynClassElements>
                                                                                  (syntax);
                                                              if (pSVar57 == (SynClassElements *)0x0
                                                                 ) {
                                                                pSVar58 = 
                                                  getType<SynClassDefinition>(syntax);
                                                  if (pSVar58 == (SynClassDefinition *)0x0) {
                                                    pSVar59 = getType<SynEnumDefinition>(syntax);
                                                    if (pSVar59 == (SynEnumDefinition *)0x0) {
                                                      pSVar60 = getType<SynNamespaceDefinition>
                                                                          (syntax);
                                                      if (pSVar60 == (SynNamespaceDefinition *)0x0)
                                                      {
                                                        pSVar61 = getType<SynModuleImport>(syntax);
                                                        if (pSVar61 == (SynModuleImport *)0x0) {
                                                          pSVar62 = getType<SynModule>(syntax);
                                                          if (pSVar62 == (SynModule *)0x0) {
                                                            if (syntax != (SynBase *)0x0) {
                                                              __assert_fail("!\"unknown type\"",
                                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseGraph.cpp"
                                                  ,0x34a,
                                                  "void PrintGraph(ParseGraphContext &, SynBase *, const char *)"
                                                  );
                                                  }
                                                  PrintIndented(ctx,name,"null");
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynModule()");
                                                    PrintEnterBlock(ctx,"imports");
                                                    for (expr_1 = &((pSVar62->imports).head)->
                                                                   super_SynBase;
                                                        expr_1 != (SynBase *)0x0;
                                                        expr_1 = &getType<SynModuleImport>
                                                                            (expr_1->next)->
                                                                  super_SynBase) {
                                                      PrintGraph(ctx,expr_1,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintEnterBlock(ctx,"expressions");
                                                    for (local_328 = (pSVar62->expressions).head;
                                                        local_328 != (SynBase *)0x0;
                                                        local_328 = local_328->next) {
                                                      PrintGraph(ctx,local_328,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                    OutputContext::Flush(ctx->output);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynModuleImport()");
                                                    for (node_60 = (SynModule *)(pSVar61->path).head
                                                        ; node_60 != (SynModule *)0x0;
                                                        node_60 = (SynModule *)
                                                                  getType<SynIdentifier>
                                                                            ((node_60->super_SynBase
                                                                             ).next)) {
                                                      PrintGraph(ctx,&node_60->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynNamespaceDefinition()");
                                                  PrintEnterBlock(ctx,"path");
                                                  for (arg_25 = &((pSVar60->path).head)->
                                                                 super_SynBase;
                                                      arg_25 != (SynBase *)0x0;
                                                      arg_25 = &getType<SynIdentifier>(arg_25->next)
                                                                ->super_SynBase) {
                                                    PrintGraph(ctx,arg_25,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"expressions");
                                                  for (node_59 = (SynModuleImport *)
                                                                 (pSVar60->expressions).head;
                                                      node_59 != (SynModuleImport *)0x0;
                                                      node_59 = (SynModuleImport *)
                                                                (node_59->super_SynBase).next) {
                                                    PrintGraph(ctx,&node_59->super_SynBase,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynEnumDefinition(%.*s)",
                                                  (ulong)(uint)((int)(pSVar59->name->name).end -
                                                               (int)(pSVar59->name->name).begin),
                                                  (pSVar59->name->name).begin);
                                                  for (node_58 = (SynNamespaceDefinition *)
                                                                 (pSVar59->values).head;
                                                      node_58 != (SynNamespaceDefinition *)0x0;
                                                      node_58 = (SynNamespaceDefinition *)
                                                                (node_58->super_SynBase).next) {
                                                    PrintGraph(ctx,&node_58->super_SynBase,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    pcVar63 = "";
                                                    if ((pSVar58->extendable & 1U) != 0) {
                                                      pcVar63 = ", extendable";
                                                    }
                                                    PrintEnterBlock(ctx,name,
                                                  "SynClassDefinition(%.*s%s)",
                                                  (ulong)(uint)((int)(pSVar58->name->name).end -
                                                               (int)(pSVar58->name->name).begin),
                                                  (pSVar58->name->name).begin,pcVar63);
                                                  PrintGraph(ctx,&pSVar58->align->super_SynBase,
                                                             "align");
                                                  PrintEnterBlock(ctx,"aliases");
                                                  for (node_57 = (SynEnumDefinition *)
                                                                 (pSVar58->aliases).head;
                                                      node_57 != (SynEnumDefinition *)0x0;
                                                      node_57 = (SynEnumDefinition *)
                                                                (node_57->super_SynBase).next) {
                                                    PrintGraph(ctx,&node_57->super_SynBase,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintGraph(ctx,pSVar58->baseClass,"baseClass");
                                                  PrintGraph(ctx,&pSVar58->elements->super_SynBase,
                                                             "elements");
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynClassElements()");
                                                    if ((pSVar57->typedefs).head !=
                                                        (SynTypedef *)0x0) {
                                                      PrintEnterBlock(ctx,"typedefs");
                                                      for (arg_18 = &((pSVar57->typedefs).head)->
                                                                     super_SynBase;
                                                          arg_18 != (SynBase *)0x0;
                                                          arg_18 = arg_18->next) {
                                                        PrintGraph(ctx,arg_18,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if ((pSVar57->functions).head !=
                                                        (SynFunctionDefinition *)0x0) {
                                                      PrintEnterBlock(ctx,"functions");
                                                      for (arg_19 = &((pSVar57->functions).head)->
                                                                     super_SynBase;
                                                          arg_19 != (SynBase *)0x0;
                                                          arg_19 = arg_19->next) {
                                                        PrintGraph(ctx,arg_19,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if ((pSVar57->accessors).head !=
                                                        (SynAccessor *)0x0) {
                                                      PrintEnterBlock(ctx,"accessors");
                                                      for (arg_20 = &((pSVar57->accessors).head)->
                                                                     super_SynBase;
                                                          arg_20 != (SynBase *)0x0;
                                                          arg_20 = arg_20->next) {
                                                        PrintGraph(ctx,arg_20,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if ((pSVar57->members).head !=
                                                        (SynVariableDefinitions *)0x0) {
                                                      PrintEnterBlock(ctx,"members");
                                                      for (arg_21 = &((pSVar57->members).head)->
                                                                     super_SynBase;
                                                          arg_21 != (SynBase *)0x0;
                                                          arg_21 = arg_21->next) {
                                                        PrintGraph(ctx,arg_21,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if ((pSVar57->constantSets).head !=
                                                        (SynConstantSet *)0x0) {
                                                      PrintEnterBlock(ctx,"constantSets");
                                                      for (arg_22 = &((pSVar57->constantSets).head)
                                                                     ->super_SynBase;
                                                          arg_22 != (SynBase *)0x0;
                                                          arg_22 = arg_22->next) {
                                                        PrintGraph(ctx,arg_22,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    if ((pSVar57->staticIfs).head !=
                                                        (SynClassStaticIf *)0x0) {
                                                      PrintEnterBlock(ctx,"staticIfs");
                                                      for (node_56 = (SynClassDefinition *)
                                                                     (pSVar57->staticIfs).head;
                                                          node_56 != (SynClassDefinition *)0x0;
                                                          node_56 = (SynClassDefinition *)
                                                                    (node_56->super_SynBase).next) {
                                                        PrintGraph(ctx,&node_56->super_SynBase,"");
                                                      }
                                                      PrintLeaveBlock(ctx);
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynClassStaticIf()");
                                                    PrintGraph(ctx,pSVar56->condition,"condition");
                                                    PrintGraph(ctx,&pSVar56->trueBlock->
                                                                    super_SynBase,"trueBlock");
                                                    PrintGraph(ctx,&pSVar56->falseBlock->
                                                                    super_SynBase,"falseBlock");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintIndented(ctx,name,"SynClassPrototype(%.*s)"
                                                                  ,(ulong)(uint)((int)(pSVar55->name
                                                                                      ->name).end -
                                                                                (int)(pSVar55->name
                                                                                     ->name).begin),
                                                                  (pSVar55->name->name).begin);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynConstantSet()");
                                                    PrintGraph(ctx,pSVar54->type,"type");
                                                    PrintEnterBlock(ctx,"constants");
                                                    for (node_53 = (SynClassPrototype *)
                                                                   (pSVar54->constants).head;
                                                        node_53 != (SynClassPrototype *)0x0;
                                                        node_53 = (SynClassPrototype *)
                                                                  (node_53->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_53->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynConstant(%.*s)",
                                                                    (ulong)(uint)((int)(pSVar53->
                                                  name->name).end - (int)(pSVar53->name->name).begin
                                                  ),(pSVar53->name->name).begin);
                                                  PrintGraph(ctx,pSVar53->value,"value");
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynShortFunctionDefinition()");
                                                  PrintEnterBlock(ctx,"arguments");
                                                  for (arg_15 = &((pSVar52->arguments).head)->
                                                                 super_SynBase;
                                                      arg_15 != (SynBase *)0x0;
                                                      arg_15 = arg_15->next) {
                                                    PrintGraph(ctx,arg_15,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"expressions");
                                                  for (node_51 = (SynConstant *)
                                                                 (pSVar52->expressions).head;
                                                      node_51 != (SynConstant *)0x0;
                                                      node_51 = (SynConstant *)
                                                                (node_51->super_SynBase).next) {
                                                    PrintGraph(ctx,&node_51->super_SynBase,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynShortFunctionArgument(%.*s)",
                                                  (ulong)(uint)((int)(pSVar51->name->name).end -
                                                               (int)(pSVar51->name->name).begin),
                                                  (pSVar51->name->name).begin);
                                                  PrintGraph(ctx,pSVar51->type,"type");
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    pcVar63 = "";
                                                    if (((pSVar50->super_SynBase).field_0x3a & 1) !=
                                                        0) {
                                                      pcVar63 = "prototype, ";
                                                    }
                                                    pcVar64 = "";
                                                    if (((pSVar50->super_SynBase).field_0x3b & 1) !=
                                                        0) {
                                                      pcVar64 = "coroutine, ";
                                                    }
                                                    pcVar65 = "";
                                                    if ((pSVar50->accessor & 1U) != 0) {
                                                      pcVar65 = "accessor, ";
                                                    }
                                                    PrintEnterBlock(ctx,name,
                                                  "SynFunctionDefinition(%s%s%s%.*s)",pcVar63,
                                                  pcVar64,pcVar65,
                                                  CONCAT44(uVar66,(int)(pSVar50->name->name).end -
                                                                  (int)(pSVar50->name->name).begin),
                                                  (pSVar50->name->name).begin);
                                                  PrintGraph(ctx,pSVar50->parentType,"parentType");
                                                  PrintGraph(ctx,pSVar50->returnType,"returnType");
                                                  PrintEnterBlock(ctx,"aliases");
                                                  for (arg_12 = &((pSVar50->aliases).head)->
                                                                 super_SynBase;
                                                      arg_12 != (SynBase *)0x0;
                                                      arg_12 = arg_12->next) {
                                                    PrintGraph(ctx,arg_12,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"arguments");
                                                  for (arg_13 = &((pSVar50->arguments).head)->
                                                                 super_SynBase;
                                                      arg_13 != (SynBase *)0x0;
                                                      arg_13 = arg_13->next) {
                                                    PrintGraph(ctx,arg_13,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintEnterBlock(ctx,"expressions");
                                                  for (node_49 = (SynShortFunctionArgument *)
                                                                 (pSVar50->expressions).head;
                                                      node_49 != (SynShortFunctionArgument *)0x0;
                                                      node_49 = (SynShortFunctionArgument *)
                                                                (node_49->super_SynBase).next) {
                                                    PrintGraph(ctx,&node_49->super_SynBase,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    pcVar63 = "";
                                                    if (((pSVar49->super_SynBase).field_0x3a & 1) !=
                                                        0) {
                                                      pcVar63 = "explicit, ";
                                                    }
                                                    PrintEnterBlock(ctx,name,
                                                  "SynFunctionArgument(%s%.*s)",pcVar63,
                                                  (ulong)(uint)((int)(pSVar49->name->name).end -
                                                               (int)(pSVar49->name->name).begin),
                                                  (pSVar49->name->name).begin);
                                                  PrintGraph(ctx,pSVar49->type,"type");
                                                  PrintGraph(ctx,pSVar49->initializer,"initializer")
                                                  ;
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    if (pSVar48->setName == (SynIdentifier *)0x0) {
                                                      PrintEnterBlock(ctx,name,"SynAccessor(%.*s)",
                                                                      (ulong)(uint)((int)(pSVar48->
                                                  name->name).end - (int)(pSVar48->name->name).begin
                                                  ),(pSVar48->name->name).begin);
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynAccessor(%.*s, %.*s)",
                                                  (ulong)(uint)((int)(pSVar48->name->name).end -
                                                               (int)(pSVar48->name->name).begin),
                                                  (pSVar48->name->name).begin,
                                                  (ulong)(uint)((int)(pSVar48->setName->name).end -
                                                               (int)(pSVar48->setName->name).begin),
                                                  (pSVar48->setName->name).begin);
                                                  }
                                                  PrintGraph(ctx,pSVar48->getBlock,"getBlock");
                                                  PrintGraph(ctx,pSVar48->setBlock,"setBlock");
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynVariableDefinitions()");
                                                  PrintGraph(ctx,&pSVar47->align->super_SynBase,
                                                             "align");
                                                  PrintGraph(ctx,pSVar47->type,"type");
                                                  PrintEnterBlock(ctx,"definitions");
                                                  for (node_46 = (SynAccessor *)
                                                                 (pSVar47->definitions).head;
                                                      node_46 != (SynAccessor *)0x0;
                                                      node_46 = (SynAccessor *)
                                                                (node_46->super_SynBase).next) {
                                                    PrintGraph(ctx,&node_46->super_SynBase,"");
                                                  }
                                                  PrintLeaveBlock(ctx);
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else if (pSVar46->initializer == (SynBase *)0x0) {
                                                    PrintIndented(ctx,name,
                                                  "SynVariableDefinition(%.*s)",
                                                  (ulong)(uint)((int)(pSVar46->name->name).end -
                                                               (int)(pSVar46->name->name).begin),
                                                  (pSVar46->name->name).begin);
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynVariableDefinition(%.*s)",
                                                  (ulong)(uint)((int)(pSVar46->name->name).end -
                                                               (int)(pSVar46->name->name).begin),
                                                  (pSVar46->name->name).begin);
                                                  PrintGraph(ctx,pSVar46->initializer,"initializer")
                                                  ;
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    pcVar63 = GetOpName(*(SynModifyAssignType *)
                                                                         &(pSVar45->super_SynBase).
                                                                          field_0x3c);
                                                    PrintEnterBlock(ctx,name,
                                                  "SynModifyAssignment(%s)",pcVar63);
                                                  PrintGraph(ctx,pSVar45->lhs,"lhs");
                                                  PrintGraph(ctx,pSVar45->rhs,"rhs");
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynAssignment()");
                                                    PrintGraph(ctx,pSVar44->lhs,"lhs");
                                                    PrintGraph(ctx,pSVar44->rhs,"rhs");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    pcVar63 = GetOpName(*(SynBinaryOpType *)
                                                                         &(pSVar43->super_SynBase).
                                                                          field_0x3c);
                                                    PrintEnterBlock(ctx,name,"SynBinaryOp(%s)",
                                                                    pcVar63);
                                                    PrintGraph(ctx,pSVar43->lhs,"lhs");
                                                    PrintGraph(ctx,pSVar43->rhs,"rhs");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    pcVar63 = GetOpName(*(SynUnaryOpType *)
                                                                         &(pSVar42->super_SynBase).
                                                                          field_0x3c);
                                                    PrintEnterBlock(ctx,name,"SynUnaryOp(%s)",
                                                                    pcVar63);
                                                    PrintGraph(ctx,pSVar42->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynSwitch()");
                                                    PrintGraph(ctx,pSVar41->condition,"condition");
                                                    PrintEnterBlock(ctx,"cases");
                                                    for (node_40 = (SynUnaryOp *)
                                                                   (pSVar41->cases).head;
                                                        node_40 != (SynUnaryOp *)0x0;
                                                        node_40 = (SynUnaryOp *)
                                                                  (node_40->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_40->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynSwitchCase()");
                                                    PrintGraph(ctx,pSVar40->value,"value");
                                                    PrintEnterBlock(ctx,"expressions");
                                                    for (node_39 = (SynSwitch *)
                                                                   (pSVar40->expressions).head;
                                                        node_39 != (SynSwitch *)0x0;
                                                        node_39 = (SynSwitch *)
                                                                  (node_39->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_39->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynDoWhile()");
                                                    PrintEnterBlock(ctx,"expressions");
                                                    for (node_38 = (SynSwitchCase *)
                                                                   (pSVar39->expressions).head;
                                                        node_38 != (SynSwitchCase *)0x0;
                                                        node_38 = (SynSwitchCase *)
                                                                  (node_38->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_38->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintGraph(ctx,pSVar39->condition,"condition");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynWhile()");
                                                    PrintGraph(ctx,pSVar38->condition,"condition");
                                                    PrintGraph(ctx,pSVar38->body,"body");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynForEach()");
                                                    PrintEnterBlock(ctx,"iterators");
                                                    for (node_36 = (SynWhile *)
                                                                   (pSVar37->iterators).head;
                                                        node_36 != (SynWhile *)0x0;
                                                        node_36 = (SynWhile *)
                                                                  (node_36->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_36->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintGraph(ctx,pSVar37->body,"body");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,
                                                  "SynForEachIterator(%.*s)",
                                                  (ulong)(uint)((int)(pSVar36->name->name).end -
                                                               (int)(pSVar36->name->name).begin),
                                                  (pSVar36->name->name).begin);
                                                  PrintGraph(ctx,pSVar36->type,"type");
                                                  PrintGraph(ctx,pSVar36->value,"value");
                                                  PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynFor()");
                                                    PrintGraph(ctx,pSVar35->initializer,
                                                               "initializer");
                                                    PrintGraph(ctx,pSVar35->condition,"condition");
                                                    PrintGraph(ctx,pSVar35->increment,"increment");
                                                    PrintGraph(ctx,pSVar35->body,"body");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynIfElse()");
                                                    PrintGraph(ctx,pSVar34->condition,"condition");
                                                    PrintGraph(ctx,pSVar34->trueBlock,"trueBlock");
                                                    PrintGraph(ctx,pSVar34->falseBlock,"falseBlock")
                                                    ;
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynBlock()");
                                                    for (node_32 = (SynIfElse *)
                                                                   (pSVar33->expressions).head;
                                                        node_32 != (SynIfElse *)0x0;
                                                        node_32 = (SynIfElse *)
                                                                  (node_32->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_32->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynContinue()");
                                                    PrintGraph(ctx,&pSVar32->number->super_SynBase,
                                                               "number");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynBreak()");
                                                    PrintGraph(ctx,&pSVar31->number->super_SynBase,
                                                               "number");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynYield()");
                                                    PrintGraph(ctx,pSVar30->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynReturn()");
                                                    PrintGraph(ctx,pSVar29->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynConditional()");
                                                    PrintGraph(ctx,pSVar28->condition,"condition");
                                                    PrintGraph(ctx,pSVar28->trueBlock,"trueBlock");
                                                    PrintGraph(ctx,pSVar28->falseBlock,"falseBlock")
                                                    ;
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynNew()");
                                                    PrintGraph(ctx,pSVar27->type,"type");
                                                    PrintEnterBlock(ctx,"arguments");
                                                    for (arg_5 = &((pSVar27->arguments).head)->
                                                                  super_SynBase;
                                                        arg_5 != (SynBase *)0x0; arg_5 = arg_5->next
                                                        ) {
                                                      PrintGraph(ctx,arg_5,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintGraph(ctx,pSVar27->count,"count");
                                                    PrintEnterBlock(ctx,"constructor");
                                                    for (node_26 = (SynConditional *)
                                                                   (pSVar27->constructor).head;
                                                        node_26 != (SynConditional *)0x0;
                                                        node_26 = (SynConditional *)
                                                                  (node_26->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_26->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynSizeof()");
                                                    PrintGraph(ctx,pSVar26->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynDereference()");
                                                    PrintGraph(ctx,pSVar25->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynGetAddress()");
                                                    PrintGraph(ctx,pSVar24->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    if ((pSVar23->isIncrement & 1U) == 0) {
                                                      local_358 = "))--";
                                                    }
                                                    else {
                                                      local_358 = "))++";
                                                    }
                                                    local_358 = local_358 + 2;
                                                    PrintEnterBlock(ctx,name,"SynPostModify(%s)",
                                                                    local_358);
                                                    PrintGraph(ctx,pSVar23->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    if ((pSVar22->isIncrement & 1U) == 0) {
                                                      local_340 = "))--";
                                                    }
                                                    else {
                                                      local_340 = "))++";
                                                    }
                                                    local_340 = local_340 + 2;
                                                    PrintEnterBlock(ctx,name,"SynPreModify(%s)",
                                                                    local_340);
                                                    PrintGraph(ctx,pSVar22->value,"value");
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynFunctionCall()");
                                                    PrintGraph(ctx,pSVar21->value,"value");
                                                    PrintEnterBlock(ctx,"aliases");
                                                    for (arg_3 = (pSVar21->aliases).head;
                                                        arg_3 != (SynBase *)0x0; arg_3 = arg_3->next
                                                        ) {
                                                      PrintGraph(ctx,arg_3,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintEnterBlock(ctx,"arguments");
                                                    for (node_20 = (SynPreModify *)
                                                                   (pSVar21->arguments).head;
                                                        node_20 != (SynPreModify *)0x0;
                                                        node_20 = (SynPreModify *)
                                                                  (node_20->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_20->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynArrayIndex()");
                                                    PrintGraph(ctx,pSVar20->value,"value");
                                                    PrintEnterBlock(ctx,"arguments");
                                                    for (node_19 = (SynFunctionCall *)
                                                                   (pSVar20->arguments).head;
                                                        node_19 != (SynFunctionCall *)0x0;
                                                        node_19 = (SynFunctionCall *)
                                                                  (node_19->super_SynBase).next) {
                                                      PrintGraph(ctx,&node_19->super_SynBase,"");
                                                    }
                                                    PrintLeaveBlock(ctx);
                                                    PrintLeaveBlock(ctx);
                                                  }
                                                }
                                                else {
                                                  if (pSVar19->name == (SynIdentifier *)0x0) {
                                                    PrintEnterBlock(ctx,name,"SynCallArgument()");
                                                  }
                                                  else {
                                                    PrintEnterBlock(ctx,name,"SynCallArgument(%.*s)"
                                                                    ,(ulong)(uint)((int)(pSVar19->
                                                  name->name).end - (int)(pSVar19->name->name).begin
                                                  ),(pSVar19->name->name).begin);
                                                  }
                                                  PrintGraph(ctx,pSVar19->value,"value");
                                                  PrintLeaveBlock(ctx);
                                                }
                                              }
                                              else {
                                                if (pSVar18->member == (SynIdentifier *)0x0) {
                                                  PrintEnterBlock(ctx,name,
                                                  "SynMemberAccess(%%missing%%)");
                                                }
                                                else {
                                                  PrintEnterBlock(ctx,name,"SynMemberAccess(%.*s)",
                                                                  (ulong)(uint)((int)(pSVar18->
                                                  member->name).end -
                                                  (int)(pSVar18->member->name).begin),
                                                  (pSVar18->member->name).begin);
                                                }
                                                PrintGraph(ctx,pSVar18->value,"value");
                                                PrintLeaveBlock(ctx);
                                              }
                                            }
                                            else {
                                              PrintEnterBlock(ctx,name,"SynTypedef(%.*s)",
                                                              (ulong)(uint)((int)(pSVar17->alias->
                                                                                 name).end -
                                                                           (int)(pSVar17->alias->
                                                                                name).begin),
                                                              (pSVar17->alias->name).begin);
                                              PrintGraph(ctx,pSVar17->type,"type");
                                              PrintLeaveBlock(ctx);
                                            }
                                          }
                                          else {
                                            PrintEnterBlock(ctx,name,"SynAlign()");
                                            PrintGraph(ctx,pSVar16->value,"value");
                                            PrintLeaveBlock(ctx);
                                          }
                                        }
                                        else {
                                          PrintEnterBlock(ctx,name,"SynGenerator()");
                                          for (node_14 = (SynAlign *)(pSVar15->expressions).head;
                                              node_14 != (SynAlign *)0x0;
                                              node_14 = (SynAlign *)(node_14->super_SynBase).next) {
                                            PrintGraph(ctx,&node_14->super_SynBase,"");
                                          }
                                          PrintLeaveBlock(ctx);
                                        }
                                      }
                                      else {
                                        PrintEnterBlock(ctx,name,"SynArray()");
                                        for (node_13 = (SynGenerator *)(pSVar14->values).head;
                                            node_13 != (SynGenerator *)0x0;
                                            node_13 = (SynGenerator *)(node_13->super_SynBase).next)
                                        {
                                          PrintGraph(ctx,&node_13->super_SynBase,"");
                                        }
                                        PrintLeaveBlock(ctx);
                                      }
                                    }
                                    else {
                                      PrintIndented(ctx,name,"SynString(%.*s)",
                                                    (ulong)(uint)((int)(pSVar13->value).end -
                                                                 (int)(pSVar13->value).begin),
                                                    (pSVar13->value).begin);
                                    }
                                  }
                                  else {
                                    PrintIndented(ctx,name,"SynCharacter(%.*s)",
                                                  (ulong)(uint)((int)(pSVar12->value).end -
                                                               (int)(pSVar12->value).begin),
                                                  (pSVar12->value).begin);
                                  }
                                }
                              }
                              else {
                                PrintIndented(ctx,name,"SynNumber(%.*s)",
                                              (ulong)(uint)((int)(pSVar11->value).end -
                                                           (int)(pSVar11->value).begin),
                                              (pSVar11->value).begin);
                              }
                            }
                            else {
                              pcVar63 = "false";
                              if (((pSVar10->super_SynBase).field_0x3a & 1) != 0) {
                                pcVar63 = "true";
                              }
                              PrintIndented(ctx,name,"SynBool(%s)",pcVar63);
                            }
                          }
                          else {
                            PrintEnterBlock(ctx,name,"SynTypeof()");
                            PrintGraph(ctx,pSVar9->value,"value");
                            PrintLeaveBlock(ctx);
                          }
                        }
                        else {
                          PrintEnterBlock(ctx,name,"SynTypeGenericInstance()");
                          PrintGraph(ctx,pSVar8->baseType,"baseType");
                          PrintEnterBlock(ctx,"types");
                          for (node_7 = (SynTypeof *)(pSVar8->types).head;
                              node_7 != (SynTypeof *)0x0;
                              node_7 = (SynTypeof *)(node_7->super_SynBase).next) {
                            PrintGraph(ctx,&node_7->super_SynBase,"");
                          }
                          PrintLeaveBlock(ctx);
                          PrintLeaveBlock(ctx);
                        }
                      }
                      else {
                        PrintEnterBlock(ctx,name,"SynTypeFunction()");
                        PrintGraph(ctx,pSVar7->returnType,"returnType");
                        PrintEnterBlock(ctx,"arguments");
                        for (node_6 = (SynTypeGenericInstance *)(pSVar7->arguments).head;
                            node_6 != (SynTypeGenericInstance *)0x0;
                            node_6 = (SynTypeGenericInstance *)(node_6->super_SynBase).next) {
                          PrintGraph(ctx,&node_6->super_SynBase,"");
                        }
                        PrintLeaveBlock(ctx);
                        PrintLeaveBlock(ctx);
                      }
                    }
                    else {
                      PrintEnterBlock(ctx,name,"SynTypeReference()");
                      PrintGraph(ctx,pSVar6->type,"type");
                      PrintLeaveBlock(ctx);
                    }
                  }
                  else {
                    PrintEnterBlock(ctx,name,"SynTypeArray()");
                    PrintGraph(ctx,pSVar5->type,"type");
                    PrintEnterBlock(ctx,"sizes");
                    for (node_4 = (SynTypeReference *)(pSVar5->sizes).head;
                        node_4 != (SynTypeReference *)0x0;
                        node_4 = (SynTypeReference *)(node_4->super_SynBase).next) {
                      PrintGraph(ctx,&node_4->super_SynBase,"");
                    }
                    PrintLeaveBlock(ctx);
                    PrintLeaveBlock(ctx);
                  }
                }
                else {
                  PrintIndented(ctx,name,"SynTypeAlias(%.*s)",
                                (ulong)(uint)((int)(pSVar4->name->name).end -
                                             (int)(pSVar4->name->name).begin),
                                (pSVar4->name->name).begin);
                }
              }
              else {
                PrintEnterBlock(ctx,name,"SynTypeSimple(%.*s)",
                                (ulong)(uint)((int)(pSVar3->name).end - (int)(pSVar3->name).begin),
                                (pSVar3->name).begin);
                for (node_2 = (SynTypeAlias *)(pSVar3->path).head; node_2 != (SynTypeAlias *)0x0;
                    node_2 = (SynTypeAlias *)getType<SynIdentifier>((node_2->super_SynBase).next)) {
                  PrintGraph(ctx,&node_2->super_SynBase,"");
                }
                PrintLeaveBlock(ctx);
              }
            }
          }
        }
        else {
          PrintIndented(ctx,name,"SynIdentifier(%.*s)",
                        (ulong)(uint)((int)(pSVar2->name).end - (int)(pSVar2->name).begin),
                        (pSVar2->name).begin);
        }
      }
    }
  }
  else {
    PrintIndented(ctx,name,"{...}");
  }
  return;
}

Assistant:

void PrintGraph(ParseGraphContext &ctx, SynBase *syntax, const char *name)
{
	if(ctx.depth > 1024)
	{
		PrintIndented(ctx, name, "{...}");
		return;
	}

	if(isType<SynError>(syntax))
	{
		PrintIndented(ctx, name, "SynError()");
	}
	else if(isType<SynNothing>(syntax))
	{
		PrintIndented(ctx, name, "SynNothing()");
	}
	else if(SynIdentifier *node = getType<SynIdentifier>(syntax))
	{
		PrintIndented(ctx, name, "SynIdentifier(%.*s)", FMT_ISTR(node->name));
	}
	else if(isType<SynTypeAuto>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeAuto()");
	}
	else if(isType<SynTypeGeneric>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeGeneric()");
	}
	else if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeSimple(%.*s)", FMT_ISTR(node->name));

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		PrintIndented(ctx, name, "SynTypeAlias(%.*s)", FMT_ISTR(node->name->name));
	}
	else if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeArray()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "sizes");

		for(SynBase *size = node->sizes.head; size; size = size->next)
			PrintGraph(ctx, size, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeReference()");

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeFunction()");

		PrintGraph(ctx, node->returnType, "returnType");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeGenericInstance()");

		PrintGraph(ctx, node->baseType, "baseType");

		PrintEnterBlock(ctx, "types");

		for(SynBase *type = node->types.head; type; type = type->next)
			PrintGraph(ctx, type, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypeof()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBool *node = getType<SynBool>(syntax))
	{
		PrintIndented(ctx, name, "SynBool(%s)", node->value ? "true" : "false");
	}
	else if(SynNumber *node = getType<SynNumber>(syntax))
	{
		PrintIndented(ctx, name, "SynNumber(%.*s)", FMT_ISTR(node->value));
	}
	else if(isType<SynNullptr>(syntax))
	{
		PrintIndented(ctx, name, "SynNullptr()");
	}
	else if(SynCharacter *node = getType<SynCharacter>(syntax))
	{
		PrintIndented(ctx, name, "SynCharacter(%.*s)", FMT_ISTR(node->value));
	}
	else if(SynString *node = getType<SynString>(syntax))
	{
		PrintIndented(ctx, name, "SynString(%.*s)", FMT_ISTR(node->value));
	}
	else if(SynArray *node = getType<SynArray>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynArray()");

		for(SynBase *value = node->values.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynGenerator *node = getType<SynGenerator>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynGenerator()");

		for(SynBase *value = node->expressions.head; value; value = value->next)
			PrintGraph(ctx, value, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynAlign *node = getType<SynAlign>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynAlign()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynTypedef(%.*s)", FMT_ISTR(node->alias->name));

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		if(node->member)
			PrintEnterBlock(ctx, name, "SynMemberAccess(%.*s)", FMT_ISTR(node->member->name));
		else
			PrintEnterBlock(ctx, name, "SynMemberAccess(%%missing%%)");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynCallArgument *node = getType<SynCallArgument>(syntax))
	{
		if(node->name)
			PrintEnterBlock(ctx, name, "SynCallArgument(%.*s)", FMT_ISTR(node->name->name));
		else
			PrintEnterBlock(ctx, name, "SynCallArgument()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynArrayIndex()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionCall *node = getType<SynFunctionCall>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionCall()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynPreModify *node = getType<SynPreModify>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynPreModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynPostModify *node = getType<SynPostModify>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynPostModify(%s)", node->isIncrement ? "++" : "--");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynGetAddress *node = getType<SynGetAddress>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynGetAddress()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynDereference *node = getType<SynDereference>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynDereference()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynSizeof *node = getType<SynSizeof>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSizeof()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynNew *node = getType<SynNew>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynNew()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->count, "count");

		PrintEnterBlock(ctx, "constructor");

		for(SynBase *arg = node->constructor.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynConditional *node = getType<SynConditional>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConditional()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynReturn *node = getType<SynReturn>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynReturn()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynYield *node = getType<SynYield>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynYield()");

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBreak *node = getType<SynBreak>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBreak()");

		PrintGraph(ctx, node->number, "number");

		PrintLeaveBlock(ctx);
	}
	else if(SynContinue *node = getType<SynContinue>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynContinue()");

		PrintGraph(ctx, node->number, "number");

		PrintLeaveBlock(ctx);
	}
	else if(SynBlock *node = getType<SynBlock>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBlock()");

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynIfElse()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynFor *node = getType<SynFor>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFor()");

		PrintGraph(ctx, node->initializer, "initializer");
		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->increment, "increment");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynForEachIterator *node = getType<SynForEachIterator>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynForEachIterator(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");
		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynForEach *node = getType<SynForEach>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynForEach()");

		PrintEnterBlock(ctx, "iterators");

		for(SynBase *arg = node->iterators.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynWhile *node = getType<SynWhile>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynWhile()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->body, "body");

		PrintLeaveBlock(ctx);
	}
	else if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynDoWhile()");

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->condition, "condition");

		PrintLeaveBlock(ctx);
	}
	else if(SynSwitchCase *node = getType<SynSwitchCase>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSwitchCase()");

		PrintGraph(ctx, node->value, "value");

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynSwitch()");

		PrintGraph(ctx, node->condition, "condition");

		PrintEnterBlock(ctx, "cases");

		for(SynBase *arg = node->cases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynUnaryOp *node = getType<SynUnaryOp>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynUnaryOp(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynBinaryOp *node = getType<SynBinaryOp>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynBinaryOp(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynAssignment *node = getType<SynAssignment>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynAssignment()");

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynModifyAssignment *node = getType<SynModifyAssignment>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModifyAssignment(%s)", GetOpName(node->type));

		PrintGraph(ctx, node->lhs, "lhs");
		PrintGraph(ctx, node->rhs, "rhs");

		PrintLeaveBlock(ctx);
	}
	else if(SynVariableDefinition *node = getType<SynVariableDefinition>(syntax))
	{
		if(node->initializer)
		{
			PrintEnterBlock(ctx, name, "SynVariableDefinition(%.*s)", FMT_ISTR(node->name->name));

			PrintGraph(ctx, node->initializer, "initializer");

			PrintLeaveBlock(ctx);
		}
		else
		{
			PrintIndented(ctx, name, "SynVariableDefinition(%.*s)", FMT_ISTR(node->name->name));
		}
	}
	else if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynVariableDefinitions()");

		PrintGraph(ctx, node->align, "align");
		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "definitions");

		for(SynBase *arg = node->definitions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynAccessor *node = getType<SynAccessor>(syntax))
	{
		if(node->setName)
			PrintEnterBlock(ctx, name, "SynAccessor(%.*s, %.*s)", FMT_ISTR(node->name->name), FMT_ISTR(node->setName->name));
		else
			PrintEnterBlock(ctx, name, "SynAccessor(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->getBlock, "getBlock");
		PrintGraph(ctx, node->setBlock, "setBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionArgument *node = getType<SynFunctionArgument>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionArgument(%s%.*s)", node->isExplicit ? "explicit, " : "", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");
		PrintGraph(ctx, node->initializer, "initializer");

		PrintLeaveBlock(ctx);
	}
	else if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynFunctionDefinition(%s%s%s%.*s)", node->prototype ? "prototype, " : "", node->coroutine ? "coroutine, " : "", node->accessor ? "accessor, " : "", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->parentType, "parentType");
		PrintGraph(ctx, node->returnType, "returnType");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynShortFunctionArgument *node = getType<SynShortFunctionArgument>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynShortFunctionArgument(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->type, "type");

		PrintLeaveBlock(ctx);
	}
	else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynShortFunctionDefinition()");

		PrintEnterBlock(ctx, "arguments");

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynConstant *node = getType<SynConstant>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConstant(%.*s)", FMT_ISTR(node->name->name));

		PrintGraph(ctx, node->value, "value");

		PrintLeaveBlock(ctx);
	}
	else if(SynConstantSet *node = getType<SynConstantSet>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynConstantSet()");

		PrintGraph(ctx, node->type, "type");

		PrintEnterBlock(ctx, "constants");

		for(SynBase *arg = node->constants.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynClassPrototype *node = getType<SynClassPrototype>(syntax))
	{
		PrintIndented(ctx, name, "SynClassPrototype(%.*s)", FMT_ISTR(node->name->name));
	}
	else if(SynClassStaticIf *node = getType<SynClassStaticIf>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassStaticIf()");

		PrintGraph(ctx, node->condition, "condition");
		PrintGraph(ctx, node->trueBlock, "trueBlock");
		PrintGraph(ctx, node->falseBlock, "falseBlock");

		PrintLeaveBlock(ctx);
	}
	else if(SynClassElements *node = getType<SynClassElements>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassElements()");

		if(node->typedefs.head)
		{
			PrintEnterBlock(ctx, "typedefs");

			for(SynBase *arg = node->typedefs.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->functions.head)
		{
			PrintEnterBlock(ctx, "functions");

			for(SynBase *arg = node->functions.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->accessors.head)
		{
			PrintEnterBlock(ctx, "accessors");

			for(SynBase *arg = node->accessors.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->members.head)
		{
			PrintEnterBlock(ctx, "members");

			for(SynBase *arg = node->members.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->constantSets.head)
		{
			PrintEnterBlock(ctx, "constantSets");

			for(SynBase *arg = node->constantSets.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		if(node->staticIfs.head)
		{
			PrintEnterBlock(ctx, "staticIfs");

			for(SynBase *arg = node->staticIfs.head; arg; arg = arg->next)
				PrintGraph(ctx, arg, "");

			PrintLeaveBlock(ctx);
		}

		PrintLeaveBlock(ctx);
	}
	else if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynClassDefinition(%.*s%s)", FMT_ISTR(node->name->name), node->extendable ? ", extendable" : "");

		PrintGraph(ctx, node->align, "align");

		PrintEnterBlock(ctx, "aliases");

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintGraph(ctx, node->baseClass, "baseClass");
		PrintGraph(ctx, node->elements, "elements");

		PrintLeaveBlock(ctx);
	}
	else if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynEnumDefinition(%.*s)", FMT_ISTR(node->name->name));

		for(SynBase *arg = node->values.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynNamespaceDefinition()");

		PrintEnterBlock(ctx, "path");

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			PrintGraph(ctx, arg, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);
	}
	else if(SynModuleImport *node = getType<SynModuleImport>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModuleImport()");

		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			PrintGraph(ctx, part, "");

		PrintLeaveBlock(ctx);
	}
	else if(SynModule *node = getType<SynModule>(syntax))
	{
		PrintEnterBlock(ctx, name, "SynModule()");

		PrintEnterBlock(ctx, "imports");

		for(SynModuleImport *import = node->imports.head; import; import = getType<SynModuleImport>(import->next))
			PrintGraph(ctx, import, "");

		PrintLeaveBlock(ctx);

		PrintEnterBlock(ctx, "expressions");

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			PrintGraph(ctx, expr, "");

		PrintLeaveBlock(ctx);

		PrintLeaveBlock(ctx);

		ctx.output.Flush();
	}
	else if(!syntax)
	{
		PrintIndented(ctx, name, "null");
	}
	else
	{
		assert(!"unknown type");
	}
}